

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

char ** findKey(MAP_HANDLE_DATA *handleData,char *key)

{
  int iVar1;
  ulong local_28;
  size_t i;
  char **result;
  char *key_local;
  MAP_HANDLE_DATA *handleData_local;
  
  if (handleData->keys != (char **)0x0) {
    for (local_28 = 0; local_28 < handleData->count; local_28 = local_28 + 1) {
      iVar1 = strcmp(handleData->keys[local_28],key);
      if (iVar1 == 0) {
        return handleData->keys + local_28;
      }
    }
  }
  return (char **)0x0;
}

Assistant:

static char** findKey(MAP_HANDLE_DATA* handleData, const char* key)
{
    char** result;
    if (handleData->keys == NULL)
    {
        result = NULL;
    }
    else
    {
        size_t i;
        result = NULL;
        for (i = 0; i < handleData->count; i++)
        {
            if (strcmp(handleData->keys[i], key) == 0)
            {
                result = handleData->keys + i;
                break;
            }
        }
    }
    return result;
}